

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLVisualSceneLoader14.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::VisualSceneLoader14::begin__node
          (VisualSceneLoader14 *this,node__AttributeData *attributeData)

{
  int iVar1;
  bool bVar2;
  uint local_38 [2];
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  ParserChar *local_20;
  ENUM__NodeType local_18;
  ParserString *local_10;
  size_t sStack_8;
  
  local_10 = (ParserString *)0x0;
  sStack_8 = 0;
  local_30 = *(undefined4 *)&attributeData->id;
  uStack_2c = *(undefined4 *)((long)&attributeData->id + 4);
  uStack_28 = *(undefined4 *)&attributeData->name;
  uStack_24 = *(undefined4 *)((long)&attributeData->name + 4);
  local_20 = attributeData->sid;
  if (attributeData->type < 4) {
    local_18 = attributeData->type;
  }
  bVar2 = (attributeData->present_attributes & 1) != 0;
  if (bVar2) {
    local_10 = (attributeData->layer).data;
    sStack_8 = (attributeData->layer).size;
  }
  local_38[0] = (uint)bVar2;
  iVar1 = (*(this->mLoader->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader.
            _vptr_ExtraDataLoader[0xe])(this->mLoader,local_38);
  return SUB41(iVar1,0);
}

Assistant:

bool VisualSceneLoader14::begin__node( const COLLADASaxFWL14::node__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__node(attributeData));
COLLADASaxFWL::node__AttributeData attrData;
attrData.present_attributes = 0;
attrData.id = attributeData.id;
attrData.name = attributeData.name;
attrData.sid = attributeData.sid;
switch (attributeData.type) {
case COLLADASaxFWL14::ENUM__NodeType__JOINT: attrData.type=COLLADASaxFWL::ENUM__NodeType__JOINT; break;
case COLLADASaxFWL14::ENUM__NodeType__NODE: attrData.type=COLLADASaxFWL::ENUM__NodeType__NODE; break;
case COLLADASaxFWL14::ENUM__NodeType__COUNT: attrData.type=COLLADASaxFWL::ENUM__NodeType__INVALID; break;
case COLLADASaxFWL14::ENUM__NodeType__NOT_PRESENT: attrData.type=COLLADASaxFWL::ENUM__NodeType__NOT_PRESENT; break;
}
if ( (attributeData.present_attributes & COLLADASaxFWL14::node__AttributeData::ATTRIBUTE_LAYER_PRESENT) == COLLADASaxFWL14::node__AttributeData::ATTRIBUTE_LAYER_PRESENT ) {
    attrData.layer = attributeData.layer;
    attrData.present_attributes |= COLLADASaxFWL::node__AttributeData::ATTRIBUTE_LAYER_PRESENT;
}
return mLoader->begin__visual_scene__node(attrData);
}